

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O1

FT_Error afm_parser_init(AFM_Parser parser,FT_Memory memory,FT_Byte *base,FT_Byte *limit)

{
  AFM_Stream pAVar1;
  FT_Error error;
  int local_2c;
  
  pAVar1 = (AFM_Stream)ft_mem_alloc(memory,0x20,&local_2c);
  if (local_2c == 0) {
    pAVar1->base = base;
    pAVar1->cursor = base;
    pAVar1->limit = limit;
    pAVar1->status = 2;
    parser->memory = memory;
    parser->stream = pAVar1;
    parser->FontInfo = (AFM_FontInfo)0x0;
    parser->get_index = (_func_FT_Int_char_ptr_FT_Offset_void_ptr *)0x0;
    local_2c = 0;
  }
  return local_2c;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  afm_parser_init( AFM_Parser  parser,
                   FT_Memory   memory,
                   FT_Byte*    base,
                   FT_Byte*    limit )
  {
    AFM_Stream  stream = NULL;
    FT_Error    error;


    if ( FT_NEW( stream ) )
      return error;

    stream->cursor = stream->base = base;
    stream->limit  = limit;

    /* don't skip the first line during the first call */
    stream->status = AFM_STREAM_STATUS_EOL;

    parser->memory    = memory;
    parser->stream    = stream;
    parser->FontInfo  = NULL;
    parser->get_index = NULL;

    return FT_Err_Ok;
  }